

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::find_modifier_prop
          (CVmObject *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,uint *argc)

{
  uint uVar1;
  bool bVar2;
  CVmMetaTable *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vm_meta_entry_t *pvVar6;
  vm_meta_entry_t *pvVar7;
  vm_meta_entry_t *pvVar8;
  
  pCVar3 = G_meta_table_X;
  pvVar6 = (vm_meta_entry_t *)(ulong)defining_obj;
  iVar4 = (**this->_vptr_CVmObject)();
  lVar5 = (long)pCVar3->reverse_map_[*(uint *)(CONCAT44(extraout_var,iVar4) + 8)];
  pvVar8 = (vm_meta_entry_t *)0x0;
  pvVar7 = pCVar3->table_ + lVar5;
  if (lVar5 < 0) {
    pvVar7 = pvVar8;
  }
  bVar2 = false;
  do {
    if (pvVar7 == (vm_meta_entry_t *)0x0) {
      return 0;
    }
    uVar1 = pvVar7->class_obj_;
    if (uVar1 == 0) {
      return 0;
    }
    uVar1 = *(uint *)(*(long *)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8) +
                     4);
    if ((bVar2 || (uint)pvVar6 == 0) || uVar1 == 0) {
      if (uVar1 != 0) {
LAB_00296b4f:
        iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x78
                            ))(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),prop,retval,self
                               ,uVar1,pvVar6,source_obj,argc);
        if (iVar4 != 0) {
          return 1;
        }
      }
    }
    else {
      if ((uVar1 == (uint)pvVar6) ||
         (iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ +
                              0x38))(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),pvVar6),
         iVar4 != 0)) {
        bVar2 = true;
        goto LAB_00296b4f;
      }
      bVar2 = false;
    }
    iVar4 = (*pvVar7->meta_->_vptr_CVmMetaclass[0xb])();
    pCVar3 = G_meta_table_X;
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      return 0;
    }
    iVar4 = (*pvVar7->meta_->_vptr_CVmMetaclass[0xb])();
    lVar5 = (long)pCVar3->reverse_map_[*(uint *)(CONCAT44(extraout_var_01,iVar4) + 8)];
    if (bVar2) {
      pvVar6 = pvVar8;
    }
    pvVar7 = pCVar3->table_ + lVar5;
    if (lVar5 < 0) {
      pvVar7 = pvVar8;
    }
  } while( true );
}

Assistant:

int CVmObject::find_modifier_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                                  vm_obj_id_t self,
                                  vm_obj_id_t orig_target_obj,
                                  vm_obj_id_t defining_obj,
                                  vm_obj_id_t *source_obj,
                                  uint *argc)
{
    vm_meta_entry_t *entry;
    int found_def_obj;

    /* we haven't yet found the defining superclass */
    found_def_obj = FALSE;

    /* get my metaclass from the dependency table */
    entry = (G_meta_table
             ->get_entry_from_reg(get_metaclass_reg()->get_reg_idx()));

    /* 
     *   if there's an associated intrinsic class object, check to see if
     *   it provides a user modifier object for this intrinsic class 
     */
    while (entry != 0 && entry->class_obj_ != VM_INVALID_OBJ)
    {
        vm_obj_id_t mod_obj;
        
        /* ask the intrinsic class object for the user modifier object */
        mod_obj = ((CVmObjClass *)vm_objp(vmg_ entry->class_obj_))
                  ->get_mod_obj();

        /* 
         *   If we have a defining object, we must ignore objects in the
         *   superclass tree until we find the defining object.  Therefore,
         *   scan up the superclass tree for mod_obj and see if we can find
         *   the defining object; when we find it, we can start looking at
         *   objects for real at the defining object's superclass.
         *   
         *   (Superclasses in modifier objects aren't real superclasses,
         *   because modifier objects are classless.  Instead, the superclass
         *   list simply implements the 'modify' chain.)  
         */
        if (mod_obj != VM_INVALID_OBJ
            && defining_obj != VM_INVALID_OBJ && !found_def_obj)
        {
            /* 
             *   if the defining object isn't among the byte-code
             *   superclasses of the modifier object, we must skip this
             *   entire intrinsic class and move to the intrinsic superclass 
             */
            if (mod_obj == defining_obj
                || vm_objp(vmg_ mod_obj)->is_instance_of(vmg_ defining_obj))
            {
                /* 
                 *   the defining object is among my modifier family - this
                 *   means that this is the intrinsic superclass where we
                 *   found the modifier method 
                 */
                found_def_obj = TRUE;
            }
            else
            {
                /*
                 *   The current defining object is not part of the modifier
                 *   chain for this intrinsic class, so we've already skipped
                 *   past this point in the intrinsic superclass tree on past
                 *   inheritances.  Simply move to the next intrinsic class
                 *   and look at its modifier.  
                 */
                goto next_intrinsic_sc;
            }
        }

        /* 
         *   If there's a modifier object, send the property request to it.
         *   We are effectively delegating the method call to the modifier
         *   object, so we must use the "inherited property" call, not the
         *   plain get_prop() call: 'self' is the original self, but the
         *   target object is the intrinsic class modifier object.  
         */
        if (mod_obj != VM_INVALID_OBJ
            && vm_objp(vmg_ mod_obj)->inh_prop(
                vmg_ prop, retval, self, mod_obj, defining_obj,
                source_obj, argc))
            return TRUE;

        /* we didn't find it in this object, so look at its super-metaclass */
    next_intrinsic_sc:
        if (entry->meta_->get_supermeta_reg() != 0)
        {
            /* get the super-metaclass ID */
            entry = (G_meta_table
                     ->get_entry_from_reg(entry->meta_
                                          ->get_supermeta_reg()
                                          ->get_reg_idx()));

            /* 
             *   if we've already found the previous defining intrinsic
             *   class, we can forget about the previous defining modifier
             *   object now: since we're moving to a new intrinsic
             *   superclass, we will have no superclass relation to the
             *   previous defining object in the new modifier family, so we
             *   can simply use the next definition of the property we find 
             */
            if (found_def_obj)
                defining_obj = VM_INVALID_OBJ;
        }
        else
        {
            /* no super-metaclass - give up */
            break;
        }
    }

    /* we don't have a modifier object, so the property is undefined */
    return FALSE;
}